

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::tetrahedrondealloc(tetgenmesh *this,tetrahedron *dyingtetrahedron)

{
  tetrahedron *dyingtetrahedron_local;
  tetgenmesh *this_local;
  
  dyingtetrahedron[4] = (tetrahedron)0x0;
  if (dyingtetrahedron[8] != (tetrahedron)0x0) {
    memorypool::dealloc(this->tet2segpool,dyingtetrahedron[8]);
  }
  if (dyingtetrahedron[9] != (tetrahedron)0x0) {
    memorypool::dealloc(this->tet2subpool,dyingtetrahedron[9]);
  }
  memorypool::dealloc(this->tetrahedrons,dyingtetrahedron);
  return;
}

Assistant:

void tetgenmesh::tetrahedrondealloc(tetrahedron *dyingtetrahedron)
{
  // Set tetrahedron's vertices to NULL. This makes it possible to detect
  //   dead tetrahedra when traversing the list of all tetrahedra.
  dyingtetrahedron[4] = (tetrahedron) NULL;

  // Dealloc the space to subfaces/subsegments.
  if (dyingtetrahedron[8] != NULL) {
    tet2segpool->dealloc((shellface *) dyingtetrahedron[8]);
  }
  if (dyingtetrahedron[9] != NULL) {
    tet2subpool->dealloc((shellface *) dyingtetrahedron[9]);
  }

  tetrahedrons->dealloc((void *) dyingtetrahedron);
}